

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_server.h
# Opt level: O3

void __thiscall rest_rpc::rpc_service::rpc_server::do_accept(rpc_server *this)

{
  size_t sVar1;
  pointer psVar2;
  io_service *io_service;
  connection *this_00;
  size_t sVar3;
  non_const_lvalue<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qicosmos[P]rest_rpc_include_rest_rpc_rpc_server_h:108:45)>
  handler2;
  size_t sVar4;
  anon_class_8_1_8991fb9c local_38;
  _Any_data local_30;
  code *local_20;
  code *local_18;
  
  this_00 = (connection *)operator_new(0x1e0);
  sVar1 = (this->io_service_pool_).next_io_service_;
  psVar2 = (this->io_service_pool_).io_services_.
           super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  sVar3 = sVar1 + 1;
  sVar4 = 0;
  if (sVar3 != (long)(this->io_service_pool_).io_services_.
                     super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) {
    sVar4 = sVar3;
  }
  io_service = psVar2[sVar1].super___shared_ptr<asio::io_context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  (this->io_service_pool_).next_io_service_ = sVar4;
  connection::connection(this_00,io_service,this->timeout_seconds_,&this->router_);
  std::__shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>::
  reset<rest_rpc::rpc_service::connection>
            (&(this->conn_).
              super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>,
             this_00);
  local_30._8_8_ = 0;
  local_18 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/rpc_server.h:99:25)>
             ::_M_invoke;
  local_20 = std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qicosmos[P]rest_rpc/include/rest_rpc/rpc_server.h:99:25)>
             ::_M_manager;
  local_30._M_unused._M_object = this;
  std::
  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
  ::operator=(&((this->conn_).
                super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->callback_,
              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<rest_rpc::rpc_service::connection>)>
               *)&local_30);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  local_38.this = this;
  asio::detail::reactive_socket_service<asio::ip::tcp>::
  async_accept<asio::basic_socket<asio::ip::tcp,asio::any_io_executor>,rest_rpc::rpc_service::rpc_server::do_accept()::_lambda(std::error_code)_1_,asio::any_io_executor>
            ((this->acceptor_).impl_.service_,&(this->acceptor_).impl_.implementation_,
             &(((this->conn_).
                super___shared_ptr<rest_rpc::rpc_service::connection,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->socket_).super_basic_socket<asio::ip::tcp,_asio::any_io_executor>,
             (endpoint_type *)0x0,&local_38,&(this->acceptor_).impl_.executor_);
  return;
}

Assistant:

void do_accept() {
    conn_.reset(new connection(io_service_pool_.get_io_service(),
                               timeout_seconds_, router_));
    conn_->set_callback([this](std::string key, std::string token,
                               std::weak_ptr<connection> conn) {
      std::unique_lock<std::mutex> lock(sub_mtx_);
      sub_map_.emplace(std::move(key) + token, conn);
      if (!token.empty()) {
        token_list_.emplace(std::move(token));
      }
    });

    acceptor_.async_accept(conn_->socket(), [this](asio::error_code ec) {
      if (!acceptor_.is_open()) {
        return;
      }

      if (ec) {
        // LOG(INFO) << "acceptor error: " <<
        // ec.message();
      } else {
#ifdef CINATRA_ENABLE_SSL
        if (!ssl_conf_.cert_file.empty()) {
          conn_->init_ssl_context(ssl_conf_);
        }
#endif
        if (on_net_err_callback_) {
          conn_->on_network_error(on_net_err_callback_);
        }
        conn_->start();
        std::unique_lock<std::mutex> lock(mtx_);
        conn_->set_conn_id(conn_id_);
        connections_.emplace(conn_id_++, conn_);
      }

      do_accept();
    });
  }